

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

void (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
               (int err,char *message,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path)

{
  size_t sVar1;
  ostream *__os;
  ostringstream str;
  undefined1 auStack_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  long local_190 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (message == (char *)0x0) {
    std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x28);
  }
  else {
    sVar1 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,message,sVar1);
  }
  local_1b0._M_dataplus._M_p._0_1_ = 0x20;
  __os = std::__ostream_insert<char,std::char_traits<char>>
                   ((ostream *)local_190,(char *)&local_1b0,1);
  local_1b0._M_string_length._0_2_ = 0x22;
  local_1b0._M_dataplus._M_p = (pointer)path;
  std::__detail::operator<<
            (__os,(_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                   *)&local_1b0);
  std::__cxx11::stringbuf::str();
  pstore::raise<pstore::errno_erc,std::__cxx11::string>((errno_erc)err,&local_1b0);
}

Assistant:

PSTORE_NO_RETURN void raise_file_error (int const err, MessageStr const message,
                                            PathStr const path) {
        std::ostringstream str;
        str << message << ' ' << pstore::quoted (path);
        raise (pstore::errno_erc{err}, str.str ());
    }